

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned.h
# Opt level: O0

void __thiscall
intgemm::AlignedVector<float>::AlignedVector<float*>
          (AlignedVector<float> *this,float *first,float *last)

{
  float *__first;
  float *in_RDX;
  float *in_RSI;
  AlignedVector<float> *in_RDI;
  size_t in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  AlignedVector<float> *in_stack_ffffffffffffffd0;
  
  AlignedVector(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  __first = begin(in_RDI);
  std::copy<float*,float*>(__first,in_RDX,in_RSI);
  return;
}

Assistant:

AlignedVector(InputIt first, InputIt last) 
      : AlignedVector(last - first) {
      std::copy(first, last, begin());
    }